

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O3

double __thiscall BMRS<UF>::Alloc(BMRS<UF> *this)

{
  uint uVar1;
  double dVar2;
  uint uVar3;
  Mat1b *pMVar4;
  int *piVar5;
  Mat1i *pMVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  long lVar10;
  uint64_t *puVar11;
  Run *pRVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar9 = *(int *)&pMVar4->field_0x8;
  iVar13 = *(int *)&pMVar4->field_0xc;
  dVar7 = UF::Alloc(((iVar13 - (iVar13 + 1 >> 0x1f)) + 1 >> 1) *
                    ((iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1) + 1,
                    &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar9 = *(int *)&pMVar4->field_0x8;
  uVar3 = *(uint *)&pMVar4->field_0xc;
  lVar10 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar10;
  piVar5 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_90,*piVar5,piVar5[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  uVar1 = iVar9 / 2 + iVar9 % 2;
  cv::Mat::~Mat(local_90);
  (this->data_compressed).height = iVar9;
  (this->data_compressed).width = uVar3;
  uVar14 = uVar3 + 0x3f;
  if (-1 < (int)uVar3) {
    uVar14 = uVar3;
  }
  iVar13 = ((int)uVar14 >> 6) + 1;
  (this->data_compressed).data_width = iVar13;
  uVar15 = (ulong)(uint)(iVar9 * iVar13) * 8;
  if (iVar9 * iVar13 < 0) {
    uVar15 = 0xffffffffffffffff;
  }
  puVar11 = (uint64_t *)operator_new__(uVar15);
  (this->data_compressed).bits = puVar11;
  (this->data_merged).height = uVar1;
  (this->data_merged).width = uVar3;
  (this->data_merged).data_width = iVar13;
  uVar15 = (ulong)(uVar1 * iVar13) * 8;
  if ((int)(uVar1 * iVar13) < 0) {
    uVar15 = 0xffffffffffffffff;
  }
  puVar11 = (uint64_t *)operator_new__(uVar15);
  (this->data_merged).bits = puVar11;
  iVar9 = iVar9 / 2 + iVar9 % 2 + -1;
  (this->data_flags).height = iVar9;
  (this->data_flags).width = uVar3;
  (this->data_flags).data_width = iVar13;
  uVar14 = iVar13 * iVar9;
  uVar15 = (ulong)uVar14 * 8;
  if ((int)uVar14 < 0) {
    uVar15 = 0xffffffffffffffff;
  }
  puVar11 = (uint64_t *)operator_new__(uVar15);
  (this->data_flags).bits = puVar11;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar6->field_0x10,0,*(long *)&pMVar6->field_0x20 - *(long *)&pMVar6->field_0x18
        );
  memset((this->data_compressed).bits,0,
         (long)(this->data_compressed).data_width * (long)(this->data_compressed).height * 8);
  memset((this->data_merged).bits,0,
         (long)(this->data_merged).data_width * (long)(this->data_merged).height * 8);
  memset((this->data_flags).bits,0,
         (long)(this->data_flags).data_width * (long)(this->data_flags).height * 8);
  lVar10 = cv::getTickCount();
  dVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  (this->data_runs).height = uVar1;
  (this->data_runs).width = uVar3;
  dVar16 = (double)lVar10 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  dVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total;
  pRVar12 = (Run *)operator_new__((ulong)(((uVar3 >> 1) + 2) * uVar1 + 1) << 3);
  (this->data_runs).runs = pRVar12;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar16;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar2 + dVar16;
  lVar10 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar10;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar6->field_0x10,0,*(long *)&pMVar6->field_0x20 - *(long *)&pMVar6->field_0x18
        );
  memset((this->data_compressed).bits,0,
         (long)(this->data_compressed).data_width * (long)(this->data_compressed).height * 8);
  memset((this->data_merged).bits,0,
         (long)(this->data_merged).data_width * (long)(this->data_merged).height * 8);
  memset((this->data_flags).bits,0,
         (long)(this->data_flags).data_width * (long)(this->data_flags).height * 8);
  lVar10 = cv::getTickCount();
  dVar2 = (double)lVar10 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar2;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar2 + (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
               total;
  auVar17._0_8_ = dVar16 * 1000.0;
  auVar17._8_8_ = dVar2 * 1000.0;
  dVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  auVar18._8_4_ = SUB84(dVar2,0);
  auVar18._0_8_ = dVar8;
  auVar18._12_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar18 = divpd(auVar17,auVar18);
  return dVar7 + (auVar18._0_8_ - auVar18._8_8_);
}

Assistant:

double Alloc() {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);

        int w(img_.cols);
        int h(img_.rows);
        int h_merge = h / 2 + h % 2;

        // Memory allocation for others
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        data_compressed.Alloc(h, w);
        data_merged.Alloc(h_merge, w);
        data_flags.Alloc(h_merge - 1, w);
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        memset(data_merged.bits, 0, data_merged.height * data_merged.data_width * sizeof(uint64_t));
        memset(data_flags.bits, 0, data_flags.height * data_flags.data_width * sizeof(uint64_t));
        perf_.stop();
        double t = perf_.last();

        // Run metadata allocation time will be calculated later
        data_runs.Alloc(h_merge, w);

        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        memset(data_merged.bits, 0, data_merged.height * data_merged.data_width * sizeof(uint64_t));
        memset(data_flags.bits, 0, data_flags.height * data_flags.data_width * sizeof(uint64_t));
        perf_.stop();
        double ma_t = t - perf_.last();

        // Return total time
        return ls_t + ma_t;
    }